

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O0

void __thiscall
CVmObjByteArray::fill_with
          (CVmObjByteArray *this,uchar val,unsigned_long start_idx,unsigned_long cnt)

{
  size_t *psVar1;
  unsigned_long uVar2;
  CVmObjByteArray *in_RCX;
  size_t *in_RDX;
  byte in_SIL;
  uchar *p;
  size_t chunk_size;
  size_t avail;
  unsigned_long rem;
  unsigned_long idx;
  size_t *bytes_avail;
  uchar *in_stack_ffffffffffffffb8;
  CVmObjByteArray *in_stack_ffffffffffffffc0;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_20;
  
  bytes_avail = in_RDX;
  psVar1 = (size_t *)get_element_count((CVmObjByteArray *)0x318d23);
  if (psVar1 < bytes_avail) {
    local_20 = (CVmObjByteArray *)0x0;
  }
  else {
    uVar2 = get_element_count((CVmObjByteArray *)0x318d58);
    local_20 = in_RCX;
    if (uVar2 < ((long)in_RDX + (long)in_RCX) - 1U) {
      uVar2 = get_element_count((CVmObjByteArray *)0x318d6f);
      local_20 = (CVmObjByteArray *)((uVar2 + 1) - (long)in_RDX);
    }
  }
  for (local_30 = local_20; local_30 != (CVmObjByteArray *)0x0;
      local_30 = (CVmObjByteArray *)((long)local_30 - (long)in_stack_ffffffffffffffc0)) {
    in_stack_ffffffffffffffb8 =
         get_ele_ptr(in_stack_ffffffffffffffc0,(unsigned_long)in_stack_ffffffffffffffb8,bytes_avail)
    ;
    in_stack_ffffffffffffffc0 = local_38;
    if (local_30 < local_38) {
      in_stack_ffffffffffffffc0 = local_30;
    }
    memset(in_stack_ffffffffffffffb8,(uint)in_SIL,(size_t)in_stack_ffffffffffffffc0);
  }
  return;
}

Assistant:

void CVmObjByteArray::fill_with(unsigned char val, unsigned long start_idx,
                                unsigned long cnt)
{
    unsigned long idx;
    unsigned long rem;
    
    /* ensure we don't overrun the array */
    if (start_idx > get_element_count())
        cnt = 0;
    else if (start_idx + cnt - 1 > get_element_count())
        cnt = get_element_count() + 1 - start_idx;

    /* continue until we exhaust the count */
    for (idx = start_idx, rem = cnt ; rem != 0 ; )
    {
        size_t avail;
        size_t chunk_size;
        unsigned char *p;
        
        /* get the next chunk */
        p = get_ele_ptr(idx, &avail);

        /* limit this chunk size to the remaining size to fill */
        chunk_size = avail;
        if (chunk_size > rem)
            chunk_size = (size_t)rem;

        /* fill this chunk */
        memset(p, val, chunk_size);

        /* skip this chunk */
        rem -= chunk_size;
        idx += chunk_size;
    }
}